

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O1

CommandOptions * read_iab_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  uint uVar1;
  MDD_t MVar2;
  long *plVar3;
  undefined8 uVar4;
  long *plVar5;
  long lVar6;
  IFileReaderFactory *in_RDX;
  uint uVar7;
  ui32_t last_frame;
  InterchangeObject *tmp_obj;
  FrameBuffer FrameBuffer;
  Result_t result;
  MXFReader Reader;
  uint local_254;
  long local_250;
  string *local_248;
  CommandOptions *local_240;
  FrameBuffer local_238 [8];
  uchar *local_230;
  uint local_220;
  uint local_21c;
  long *local_210 [2];
  long local_200 [11];
  int local_1a8 [26];
  MXFReader local_140 [64];
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  AS_02::IAB::MXFReader::MXFReader(local_140,in_RDX);
  ASDCP::FrameBuffer::FrameBuffer(local_238);
  local_254 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_210,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,
             (allocator<char> *)&local_250);
  local_248 = (string *)local_1a8;
  AS_02::IAB::MXFReader::OpenRead(local_248);
  if (local_210[0] != local_200) {
    operator_delete(local_210[0],local_200[0] + 1);
  }
  if (-1 < local_1a8[0]) {
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      read_iab_file();
    }
    local_250 = 0;
    plVar3 = (long *)AS_02::IAB::MXFReader::OP1aHeader();
    MVar2 = ASDCP::DefaultCompositeDict();
    uVar4 = ASDCP::Dictionary::Type(MVar2);
    (**(code **)(*plVar3 + 0xa8))(local_210,plVar3,uVar4,&local_250);
    Kumu::Result_t::operator=((Result_t *)local_1a8,(Result_t *)local_210);
    Kumu::Result_t::~Result_t((Result_t *)local_210);
    if (-1 < local_1a8[0]) {
      if (local_250 == 0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(local_250,&ASDCP::MXF::InterchangeObject::typeinfo,
                                        &ASDCP::MXF::IABEssenceDescriptor::typeinfo,0);
      }
      if (plVar3 == (long *)0x0) {
        read_iab_file();
      }
      else {
        if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
          (**(code **)(*plVar3 + 0x88))(plVar3,0);
        }
        if (plVar3[0x1f] == 0) {
          fwrite("ContainerDuration not set in file descriptor, attempting to use index duration.\n"
                 ,0x50,1,_stderr);
          AS_02::IAB::MXFReader::GetFrameCount((uint *)local_98);
          Kumu::Result_t::~Result_t(local_98);
        }
        else {
          local_254 = (uint)plVar3[0x1f];
        }
        if (local_254 == 0) {
          fwrite("ContainerDuration not set in index, attempting to use Duration from SourceClip.\n"
                 ,0x50,1,_stderr);
          plVar5 = (long *)AS_02::IAB::MXFReader::OP1aHeader();
          MVar2 = ASDCP::DefaultCompositeDict();
          uVar4 = ASDCP::Dictionary::Type(MVar2);
          (**(code **)(*plVar5 + 0xa8))(local_210,plVar5,uVar4,&local_250);
          Kumu::Result_t::operator=((Result_t *)local_1a8,(Result_t *)local_210);
          Kumu::Result_t::~Result_t((Result_t *)local_210);
          if ((-1 < local_1a8[0]) &&
             (lVar6 = __dynamic_cast(local_250,&ASDCP::MXF::InterchangeObject::typeinfo,
                                     &ASDCP::MXF::SourceClip::typeinfo,0),
             *(char *)(lVar6 + 200) != '\0')) {
            local_254 = *(uint *)(lVar6 + 0xc0);
          }
        }
        if (local_254 != 0) {
          ASDCP::FrameBuffer::Capacity((uint)local_100);
          Kumu::Result_t::~Result_t(local_100);
          local_254 = *(uint *)(plVar3 + 0x1f);
          goto LAB_0010bf0d;
        }
        read_iab_file();
      }
      Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
      goto LAB_0010c022;
    }
  }
LAB_0010bf0d:
  if (local_1a8[0] < 0) {
LAB_0010bf4d:
    if ((-1 < local_1a8[0]) &&
       (uVar7 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4),
       uVar7 < local_254)) {
      local_248 = (string *)local_1a8;
      local_240 = Options;
      do {
        AS_02::IAB::MXFReader::ReadFrame((uint)(Result_t *)local_210,(FrameBuffer *)local_140);
        Kumu::Result_t::operator=((Result_t *)local_1a8,(Result_t *)local_210);
        Kumu::Result_t::~Result_t((Result_t *)local_210);
        if ((-1 < local_1a8[0]) &&
           (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01')) {
          local_21c = uVar7;
          fprintf(_stdout,"Frame(%d):\n",(ulong)uVar7);
          uVar1 = *(uint *)&fileReaderFactory[1]._vptr_IFileReaderFactory;
          if (local_220 < *(uint *)&fileReaderFactory[1]._vptr_IFileReaderFactory) {
            uVar1 = local_220;
          }
          Kumu::hexdump(local_230,uVar1,_stdout);
        }
        Options = local_240;
      } while ((-1 < local_1a8[0]) && (uVar7 = uVar7 + 1, uVar7 < local_254));
    }
  }
  else {
    uVar7 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
    if ((uVar7 != 0) && (uVar7 < local_254)) {
      local_254 = uVar7;
    }
    uVar7 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
    if (uVar7 == 0) {
LAB_0010bf49:
      local_254 = local_254 - uVar7;
      goto LAB_0010bf4d;
    }
    if (uVar7 <= local_254) {
      if (local_254 + uVar7 < local_254) {
        local_254 = local_254 + uVar7;
      }
      goto LAB_0010bf49;
    }
    read_iab_file();
    local_248 = (string *)&Kumu::RESULT_FAIL;
  }
  Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)local_248);
LAB_0010c022:
  Kumu::Result_t::~Result_t((Result_t *)local_1a8);
  ASDCP::FrameBuffer::~FrameBuffer(local_238);
  AS_02::IAB::MXFReader::~MXFReader(local_140);
  return Options;
}

Assistant:

Result_t read_iab_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
    AESDecContext*     Context = 0;
    HMACContext*       HMAC = 0;
    AS_02::IAB::MXFReader Reader(fileReaderFactory);
    ASDCP::FrameBuffer   FrameBuffer;

    ui32_t last_frame = 0;
    ASDCP::MXF::IABEssenceDescriptor *iab_descriptor = 0;

    Result_t result = Reader.OpenRead(Options.input_filename);

    if ( KM_SUCCESS(result) )
    {
        if ( Options.verbose_flag )
        {
            fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
        }

        ASDCP::MXF::InterchangeObject* tmp_obj = 0;

        result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_IABEssenceDescriptor), &tmp_obj);

        if ( KM_SUCCESS(result) )
        {
            iab_descriptor = dynamic_cast<ASDCP::MXF::IABEssenceDescriptor*>(tmp_obj);

            if ( iab_descriptor == 0 )
            {
                fprintf(stderr, "File does not contain an essence descriptor.\n");
                return RESULT_FAIL;
            }

            if ( Options.verbose_flag )
            {
                iab_descriptor->Dump();
            }

            if ( iab_descriptor->ContainerDuration.get() == 0 )
            {
                fprintf(stderr, "ContainerDuration not set in file descriptor, attempting to use index duration.\n");
                Reader.GetFrameCount(last_frame);
            }
            else
            {
                last_frame = (ui32_t)iab_descriptor->ContainerDuration;
            }

            if ( last_frame == 0 )
            {
                fprintf(stderr, "ContainerDuration not set in index, attempting to use Duration from SourceClip.\n");
                result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_SourceClip), &tmp_obj);
                if ( KM_SUCCESS(result))
                {
                    ASDCP::MXF::SourceClip *sourceClip = dynamic_cast<ASDCP::MXF::SourceClip*>(tmp_obj);
                    if ( ! sourceClip->Duration.empty() )
                    {
                        last_frame = (ui32_t)sourceClip->Duration;
                    }
                }
            }

            if ( last_frame == 0 )
            {
                fprintf(stderr, "Unable to determine file duration.\n");
                return RESULT_FAIL;
            }

            assert(iab_descriptor);
            FrameBuffer.Capacity(24000); // TODO what size?
            last_frame = (ui32_t)iab_descriptor->ContainerDuration;
        }
    }

    if ( ASDCP_SUCCESS(result) )
    {
        if ( Options.duration > 0 && Options.duration < last_frame )
            last_frame = Options.duration;

        if ( Options.start_frame > 0 )
        {
            if ( Options.start_frame > last_frame )
            {
                fprintf(stderr, "Start value greater than file duration.\n");
                return RESULT_FAIL;
            }

            last_frame = Kumu::xmin(Options.start_frame + last_frame, last_frame);
        }

        last_frame = last_frame - Options.start_frame;


    }

    for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
        result = Reader.ReadFrame(i, FrameBuffer);

        if ( ASDCP_SUCCESS(result) )
        {
            if ( Options.verbose_flag )
            {
                FrameBuffer.FrameNumber(i);
                fprintf(stdout, "Frame(%d):\n", i);
                Kumu::hexdump(FrameBuffer.RoData(), Kumu::xmin(FrameBuffer.Size(), (ui32_t)Options.fb_dump_size), stdout);
            }
        }
    }

    return result;
}